

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1load.c
# Opt level: O1

void parse_charstrings(T1_Face face,T1_Loader loader)

{
  byte bVar1;
  FT_Memory pFVar2;
  FT_Byte *pFVar3;
  FT_Byte *pFVar4;
  byte *pbVar5;
  byte *pbVar6;
  bool bVar7;
  PS_Table pPVar8;
  T1_Loader pTVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  ulong uVar14;
  FT_Pointer __dest;
  byte *pbVar15;
  char cVar16;
  ulong uVar17;
  uint uVar18;
  long lVar19;
  FT_Byte *local_90;
  FT_Byte *base;
  T1_Face local_80;
  ulong local_78;
  FT_ULong size;
  PS_Table local_68;
  PS_Table local_60;
  uint local_54;
  PS_Table local_50;
  int local_48;
  int local_44;
  T1_Loader local_40;
  FT_Error local_34 [2];
  FT_Error error;
  FT_Long FVar13;
  
  pFVar2 = (loader->parser).root.memory;
  pFVar3 = (FT_Byte *)face->psaux;
  pFVar4 = (loader->parser).root.cursor;
  pbVar5 = (loader->parser).root.limit;
  local_40 = loader;
  FVar13 = (*(loader->parser).root.funcs.to_int)((PS_Parser)loader);
  uVar10 = (uint)FVar13;
  if (-1 < (int)uVar10) {
    lVar19 = (long)pbVar5 - (long)pFVar4 >> 3;
    uVar18 = (uint)lVar19;
    if ((long)(ulong)(uVar10 & 0x7fffffff) <= lVar19) {
      uVar18 = uVar10;
    }
    if (uVar18 == 0) {
      return;
    }
    if ((local_40->parser).root.error != 0) {
      return;
    }
    local_50 = &local_40->charstrings;
    local_68 = &local_40->glyph_names;
    local_60 = &local_40->swap_table;
    base = pFVar3;
    local_80 = face;
    size = (FT_ULong)pFVar2;
    if (local_40->num_glyphs == 0) {
      local_34[0] = (*(code *)**(undefined8 **)pFVar3)(local_50,uVar18 + 6,pFVar2);
      if (((local_34[0] != 0) ||
          (local_34[0] = (*(code *)**(undefined8 **)base)(local_68,uVar18 + 6,size),
          local_34[0] != 0)) ||
         (local_34[0] = (*(code *)**(undefined8 **)base)(local_60,4,size), local_34[0] != 0))
      goto switchD_00236650_caseD_2;
    }
    local_48 = 0;
    local_54 = 0;
    local_44 = 0;
switchD_00236650_caseD_0:
    pTVar9 = local_40;
    (*(local_40->parser).root.funcs.skip_spaces)((PS_Parser)local_40);
    pbVar15 = (pTVar9->parser).root.cursor;
    cVar16 = '\x05';
    if (pbVar5 <= pbVar15) goto LAB_00236635;
    if (pbVar15 + 3 < pbVar5) {
      bVar1 = pbVar15[3];
      if (((0x3e < (ulong)bVar1) || ((0x5000832100003601U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) &&
         ((0x22 < bVar1 - 0x5b || ((0x500000005U >> ((ulong)(bVar1 - 0x5b) & 0x3f) & 1) == 0))))
      goto LAB_002364dd;
      if (*pbVar15 == 0x65) {
        if ((pbVar15[1] != 0x6e) || (pbVar15[2] != 100)) goto LAB_002364dd;
      }
      else if (((*pbVar15 != 100) || (pbVar15[1] != 0x65)) ||
              ((pbVar15[2] != 0x66 || (local_44 == 0)))) goto LAB_002364dd;
    }
    else {
LAB_002364dd:
      (*(pTVar9->parser).root.funcs.skip_PS_token)((PS_Parser)pTVar9);
      pbVar6 = (pTVar9->parser).root.cursor;
      if (pbVar6 < pbVar5) {
        cVar16 = '\x01';
        if ((pTVar9->parser).root.error == 0) {
          if (*pbVar15 == 0x2f) {
            if (pbVar5 <= pbVar15 + 2) goto LAB_00236628;
            iVar11 = read_binary_data(&local_40->parser,&local_78,&local_90,
                                      ((local_80->root).internal)->incremental_interface !=
                                      (FT_Incremental_InterfaceRec *)0x0);
            if ((iVar11 != 0) && (cVar16 = '\x06', local_40->num_glyphs == 0)) {
              pbVar15 = pbVar15 + 1;
              uVar17 = (long)pbVar6 - (long)pbVar15;
              local_34[0] = (*(local_40->glyph_names).funcs.add)
                                      (local_68,local_44,pbVar15,(int)uVar17 + 1);
              iVar11 = local_44;
              cVar16 = '\x02';
              if (local_34[0] == 0) {
                (local_40->glyph_names).elements[local_44][uVar17 & 0xffffffff] = '\0';
                if (*pbVar15 == 0x2e) {
                  iVar12 = strcmp(".notdef",(char *)(local_40->glyph_names).elements[local_44]);
                  if (iVar12 == 0) {
                    local_48 = iVar11;
                  }
                  local_54 = local_54 & 0xff;
                  if (iVar12 == 0) {
                    local_54 = 1;
                  }
                }
                uVar17 = local_78;
                uVar14 = (ulong)(local_80->type1).private_dict.lenIV;
                if (((long)uVar14 < 0) || ((int)(uVar18 + 5) <= iVar11)) {
                  local_34[0] = (*(local_40->charstrings).funcs.add)
                                          (local_50,iVar11,local_90,(FT_UInt)local_78);
                }
                else {
                  if (uVar14 < local_78) {
                    __dest = ft_mem_alloc((FT_Memory)size,local_78,local_34);
                    cVar16 = '\0';
                    if (local_34[0] != 0) goto LAB_0023667e;
                    memcpy(__dest,local_90,uVar17);
                    (**(code **)(base + 0x20))(__dest,uVar17,0x10ea);
                    lVar19 = (long)(local_80->type1).private_dict.lenIV;
                    local_78 = uVar17 - lVar19;
                    local_34[0] = (*(local_40->charstrings).funcs.add)
                                            (local_50,local_44,(void *)((long)__dest + lVar19),
                                             (FT_UInt)local_78);
                    ft_mem_free((FT_Memory)size,__dest);
                    bVar7 = true;
                  }
                  else {
                    local_34[0] = 3;
LAB_0023667e:
                    cVar16 = '\x02';
                    bVar7 = false;
                  }
                  if (!bVar7) goto LAB_00236635;
                }
                cVar16 = (local_34[0] != 0) * '\x02';
                local_44 = local_44 + (uint)(local_34[0] == 0);
              }
            }
          }
          else {
            cVar16 = '\0';
          }
        }
      }
      else {
LAB_00236628:
        local_34[0] = 3;
        cVar16 = '\x02';
      }
    }
LAB_00236635:
    pTVar9 = local_40;
    iVar11 = local_44;
    pPVar8 = local_60;
    switch(cVar16) {
    case '\0':
    case '\x06':
      goto switchD_00236650_caseD_0;
    default:
      goto switchD_00236650_caseD_1;
    case '\x02':
      goto switchD_00236650_caseD_2;
    case '\x05':
      if (local_44 == 0) break;
      local_40->num_glyphs = local_44;
      if ((char)local_54 == '\0') {
        local_78 = CONCAT35(local_78._5_3_,0xe00000000);
        local_78 = CONCAT44(local_78._4_4_,0xde1f78b);
        local_34[0] = (*(local_40->swap_table).funcs.add)
                                (local_60,0,*(local_40->glyph_names).elements,
                                 *(local_40->glyph_names).lengths);
        if (((((local_34[0] == 0) &&
              (local_34[0] = (*(pTVar9->swap_table).funcs.add)
                                       (pPVar8,1,*(pTVar9->charstrings).elements,
                                        *(pTVar9->charstrings).lengths), local_34[0] == 0)) &&
             (local_34[0] = (*(pTVar9->glyph_names).funcs.add)(local_68,0,".notdef",8),
             local_34[0] == 0)) &&
            ((local_34[0] = (*(pTVar9->charstrings).funcs.add)(local_50,0,&local_78,5),
             local_34[0] == 0 &&
             (local_34[0] = (*(pTVar9->glyph_names).funcs.add)
                                      (local_68,iVar11,*(pTVar9->swap_table).elements,
                                       *(pTVar9->swap_table).lengths), local_34[0] == 0)))) &&
           (local_34[0] = (*(pTVar9->charstrings).funcs.add)
                                    (local_50,iVar11,(pTVar9->swap_table).elements[1],
                                     (pTVar9->swap_table).lengths[1]), local_34[0] == 0)) {
          pTVar9->num_glyphs = pTVar9->num_glyphs + 1;
          return;
        }
      }
      else {
        pFVar3 = *(local_40->glyph_names).elements;
        iVar11 = strcmp(".notdef",(char *)pFVar3);
        if (iVar11 == 0) {
          return;
        }
        local_34[0] = (*(local_40->swap_table).funcs.add)
                                (local_60,0,pFVar3,*(local_40->glyph_names).lengths);
        if ((local_34[0] == 0) &&
           (local_34[0] = (*(local_40->swap_table).funcs.add)
                                    (local_60,1,*(local_40->charstrings).elements,
                                     *(local_40->charstrings).lengths), local_34[0] == 0)) {
          lVar19 = (long)local_48;
          local_34[0] = (*(local_40->swap_table).funcs.add)
                                  (local_60,2,(local_40->glyph_names).elements[lVar19],
                                   (local_40->glyph_names).lengths[lVar19]);
          if (((local_34[0] == 0) &&
              (((local_34[0] = (*(local_40->swap_table).funcs.add)
                                         (local_60,3,(local_40->charstrings).elements[lVar19],
                                          (local_40->charstrings).lengths[lVar19]), local_34[0] == 0
                && (local_34[0] = (*(local_40->glyph_names).funcs.add)
                                            (local_68,local_48,*(local_40->swap_table).elements,
                                             *(local_40->swap_table).lengths), local_34[0] == 0)) &&
               (local_34[0] = (*(local_40->charstrings).funcs.add)
                                        (local_50,local_48,(local_40->swap_table).elements[1],
                                         (local_40->swap_table).lengths[1]), local_34[0] == 0)))) &&
             ((local_34[0] = (*(local_40->glyph_names).funcs.add)
                                       (local_68,0,(local_40->swap_table).elements[2],
                                        (local_40->swap_table).lengths[2]), local_34[0] == 0 &&
              (local_34[0] = (*(local_40->charstrings).funcs.add)
                                       (local_50,0,(local_40->swap_table).elements[3],
                                        (local_40->swap_table).lengths[3]), local_34[0] == 0)))) {
            return;
          }
        }
      }
      goto switchD_00236650_caseD_2;
    }
  }
  local_34[0] = 3;
switchD_00236650_caseD_2:
  (local_40->parser).root.error = local_34[0];
switchD_00236650_caseD_1:
  return;
}

Assistant:

static void
  parse_charstrings( T1_Face    face,
                     T1_Loader  loader )
  {
    T1_Parser      parser       = &loader->parser;
    PS_Table       code_table   = &loader->charstrings;
    PS_Table       name_table   = &loader->glyph_names;
    PS_Table       swap_table   = &loader->swap_table;
    FT_Memory      memory       = parser->root.memory;
    FT_Error       error;

    PSAux_Service  psaux        = (PSAux_Service)face->psaux;

    FT_Byte*       cur          = parser->root.cursor;
    FT_Byte*       limit        = parser->root.limit;
    FT_Int         n, num_glyphs;
    FT_Int         notdef_index = 0;
    FT_Byte        notdef_found = 0;


    num_glyphs = (FT_Int)T1_ToInt( parser );
    if ( num_glyphs < 0 )
    {
      error = FT_THROW( Invalid_File_Format );
      goto Fail;
    }

    /* we certainly need more than 8 bytes per glyph */
    if ( num_glyphs > ( limit - cur ) >> 3 )
    {
      FT_TRACE0(( "parse_charstrings: adjusting number of glyphs"
                  " (from %d to %d)\n",
                  num_glyphs, ( limit - cur ) >> 3 ));
      num_glyphs = ( limit - cur ) >> 3;
    }

    /* some fonts like Optima-Oblique not only define the /CharStrings */
    /* array but access it also                                        */
    if ( num_glyphs == 0 || parser->root.error )
      return;

    /* initialize tables, leaving space for addition of .notdef, */
    /* if necessary, and a few other glyphs to handle buggy      */
    /* fonts which have more glyphs than specified.              */

    /* for some non-standard fonts like `Optima' which provides  */
    /* different outlines depending on the resolution it is      */
    /* possible to get here twice                                */
    if ( !loader->num_glyphs )
    {
      error = psaux->ps_table_funcs->init(
                code_table, num_glyphs + 1 + TABLE_EXTEND, memory );
      if ( error )
        goto Fail;

      error = psaux->ps_table_funcs->init(
                name_table, num_glyphs + 1 + TABLE_EXTEND, memory );
      if ( error )
        goto Fail;

      /* Initialize table for swapping index notdef_index and */
      /* index 0 names and codes (if necessary).              */

      error = psaux->ps_table_funcs->init( swap_table, 4, memory );
      if ( error )
        goto Fail;
    }

    n = 0;

    for (;;)
    {
      FT_ULong  size;
      FT_Byte*  base;


      /* the format is simple:        */
      /*   `/glyphname' + binary data */

      T1_Skip_Spaces( parser );

      cur = parser->root.cursor;
      if ( cur >= limit )
        break;

      /* we stop when we find a `def' or `end' keyword */
      if ( cur + 3 < limit && IS_PS_DELIM( cur[3] ) )
      {
        if ( cur[0] == 'd' &&
             cur[1] == 'e' &&
             cur[2] == 'f' )
        {
          /* There are fonts which have this: */
          /*                                  */
          /*   /CharStrings 118 dict def      */
          /*   Private begin                  */
          /*   CharStrings begin              */
          /*   ...                            */
          /*                                  */
          /* To catch this we ignore `def' if */
          /* no charstring has actually been  */
          /* seen.                            */
          if ( n )
            break;
        }

        if ( cur[0] == 'e' &&
             cur[1] == 'n' &&
             cur[2] == 'd' )
          break;
      }

      T1_Skip_PS_Token( parser );
      if ( parser->root.cursor >= limit )
      {
        error = FT_THROW( Invalid_File_Format );
        goto Fail;
      }
      if ( parser->root.error )
        return;

      if ( *cur == '/' )
      {
        FT_UInt  len;


        if ( cur + 2 >= limit )
        {
          error = FT_THROW( Invalid_File_Format );
          goto Fail;
        }

        cur++;                              /* skip `/' */
        len = (FT_UInt)( parser->root.cursor - cur );

        if ( !read_binary_data( parser, &size, &base, IS_INCREMENTAL ) )
          return;

        /* for some non-standard fonts like `Optima' which provides */
        /* different outlines depending on the resolution it is     */
        /* possible to get here twice                               */
        if ( loader->num_glyphs )
          continue;

        error = T1_Add_Table( name_table, n, cur, len + 1 );
        if ( error )
          goto Fail;

        /* add a trailing zero to the name table */
        name_table->elements[n][len] = '\0';

        /* record index of /.notdef */
        if ( *cur == '.'                                              &&
             ft_strcmp( ".notdef",
                        (const char*)(name_table->elements[n]) ) == 0 )
        {
          notdef_index = n;
          notdef_found = 1;
        }

        if ( face->type1.private_dict.lenIV >= 0 &&
             n < num_glyphs + TABLE_EXTEND       )
        {
          FT_Byte*  temp = NULL;


          if ( size <= (FT_ULong)face->type1.private_dict.lenIV )
          {
            error = FT_THROW( Invalid_File_Format );
            goto Fail;
          }

          /* t1_decrypt() shouldn't write to base -- make temporary copy */
          if ( FT_ALLOC( temp, size ) )
            goto Fail;
          FT_MEM_COPY( temp, base, size );
          psaux->t1_decrypt( temp, size, 4330 );
          size -= (FT_ULong)face->type1.private_dict.lenIV;
          error = T1_Add_Table( code_table, n,
                                temp + face->type1.private_dict.lenIV, size );
          FT_FREE( temp );
        }
        else
          error = T1_Add_Table( code_table, n, base, size );
        if ( error )
          goto Fail;

        n++;
      }
    }

    if ( !n )
    {
      error = FT_THROW( Invalid_File_Format );
      goto Fail;
    }

    loader->num_glyphs = n;

    /* if /.notdef is found but does not occupy index 0, do our magic. */
    if ( notdef_found                                                 &&
         ft_strcmp( ".notdef", (const char*)name_table->elements[0] ) )
    {
      /* Swap glyph in index 0 with /.notdef glyph.  First, add index 0  */
      /* name and code entries to swap_table.  Then place notdef_index   */
      /* name and code entries into swap_table.  Then swap name and code */
      /* entries at indices notdef_index and 0 using values stored in    */
      /* swap_table.                                                     */

      /* Index 0 name */
      error = T1_Add_Table( swap_table, 0,
                            name_table->elements[0],
                            name_table->lengths [0] );
      if ( error )
        goto Fail;

      /* Index 0 code */
      error = T1_Add_Table( swap_table, 1,
                            code_table->elements[0],
                            code_table->lengths [0] );
      if ( error )
        goto Fail;

      /* Index notdef_index name */
      error = T1_Add_Table( swap_table, 2,
                            name_table->elements[notdef_index],
                            name_table->lengths [notdef_index] );
      if ( error )
        goto Fail;

      /* Index notdef_index code */
      error = T1_Add_Table( swap_table, 3,
                            code_table->elements[notdef_index],
                            code_table->lengths [notdef_index] );
      if ( error )
        goto Fail;

      error = T1_Add_Table( name_table, notdef_index,
                            swap_table->elements[0],
                            swap_table->lengths [0] );
      if ( error )
        goto Fail;

      error = T1_Add_Table( code_table, notdef_index,
                            swap_table->elements[1],
                            swap_table->lengths [1] );
      if ( error )
        goto Fail;

      error = T1_Add_Table( name_table, 0,
                            swap_table->elements[2],
                            swap_table->lengths [2] );
      if ( error )
        goto Fail;

      error = T1_Add_Table( code_table, 0,
                            swap_table->elements[3],
                            swap_table->lengths [3] );
      if ( error )
        goto Fail;

    }
    else if ( !notdef_found )
    {
      /* notdef_index is already 0, or /.notdef is undefined in   */
      /* charstrings dictionary.  Worry about /.notdef undefined. */
      /* We take index 0 and add it to the end of the table(s)    */
      /* and add our own /.notdef glyph to index 0.               */

      /* 0 333 hsbw endchar */
      FT_Byte  notdef_glyph[] = { 0x8B, 0xF7, 0xE1, 0x0D, 0x0E };
      char*    notdef_name    = (char *)".notdef";


      error = T1_Add_Table( swap_table, 0,
                            name_table->elements[0],
                            name_table->lengths [0] );
      if ( error )
        goto Fail;

      error = T1_Add_Table( swap_table, 1,
                            code_table->elements[0],
                            code_table->lengths [0] );
      if ( error )
        goto Fail;

      error = T1_Add_Table( name_table, 0, notdef_name, 8 );
      if ( error )
        goto Fail;

      error = T1_Add_Table( code_table, 0, notdef_glyph, 5 );

      if ( error )
        goto Fail;

      error = T1_Add_Table( name_table, n,
                            swap_table->elements[0],
                            swap_table->lengths [0] );
      if ( error )
        goto Fail;

      error = T1_Add_Table( code_table, n,
                            swap_table->elements[1],
                            swap_table->lengths [1] );
      if ( error )
        goto Fail;

      /* we added a glyph. */
      loader->num_glyphs += 1;
    }

    return;

  Fail:
    parser->root.error = error;
  }